

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O3

void emit_loadi(ASMState *as,Reg r,int32_t i)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar2 = as->mcp;
  bVar1 = (byte)r;
  if ((i == 0) && ((*pbVar2 == 0xf || ((*pbVar2 & 0xf0) != 0x70)))) {
    pbVar2[-1] = (bVar1 & 7) + bVar1 * '\b' | 0xc0;
    pbVar2[-2] = 0x33;
    uVar3 = r >> 3 & 1 | r >> 1 & 0x104;
    if (uVar3 == 0) {
      pbVar2 = pbVar2 + -2;
    }
    else {
      pbVar2[-3] = (byte)uVar3 | (byte)(r >> 0x10) | 0x40;
      pbVar2 = pbVar2 + -3;
    }
  }
  else {
    *(int32_t *)(pbVar2 + -4) = i;
    pbVar2[-5] = bVar1 & 7 | 0xb8;
    if ((r & 8) == 0) {
      pbVar2 = pbVar2 + -5;
    }
    else {
      pbVar2[-6] = 0x41;
      pbVar2 = pbVar2 + -6;
    }
  }
  as->mcp = pbVar2;
  return;
}

Assistant:

static void emit_loadi(ASMState *as, Reg r, int32_t i)
{
  /* XOR r,r is shorter, but modifies the flags. This is bad for HIOP/jcc. */
  if (i == 0 && !(LJ_32 && (IR(as->curins)->o == IR_HIOP ||
			    (as->curins+1 < as->T->nins &&
			     IR(as->curins+1)->o == IR_HIOP))) &&
		!((*as->mcp == 0x0f && (as->mcp[1] & 0xf0) == XI_JCCn) ||
		  (*as->mcp & 0xf0) == XI_JCCs)) {
    emit_rr(as, XO_ARITH(XOg_XOR), r, r);
  } else {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = i;
    p[-5] = (MCode)(XI_MOVri+(r&7));
    p -= 5;
    REXRB(p, 0, r);
    as->mcp = p;
  }
}